

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.hpp
# Opt level: O3

void __thiscall Item::~Item(Item *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_GreenCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_00118290;
  pcVar2 = (this->cardText)._M_dataplus._M_p;
  paVar1 = &(this->cardText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  GreenCard::~GreenCard(&this->super_GreenCard);
  return;
}

Assistant:

virtual ~Item() {}